

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

bool libtorrent::aux::string_begins_no_case(char *s1,char *s2)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  
  for (lVar3 = 0; cVar1 = s1[lVar3], cVar1 != '\0'; lVar3 = lVar3 + 1) {
    cVar4 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar4 = cVar1;
    }
    cVar2 = s2[lVar3];
    cVar5 = cVar2 + ' ';
    if (0x19 < (byte)(cVar2 + 0xbfU)) {
      cVar5 = cVar2;
    }
    if (cVar4 != cVar5) break;
  }
  return cVar1 == '\0';
}

Assistant:

bool string_begins_no_case(char const* s1, char const* s2)
	{
		TORRENT_ASSERT(s1 != nullptr);
		TORRENT_ASSERT(s2 != nullptr);

		while (*s1 != 0)
		{
			if (to_lower(*s1) != to_lower(*s2)) return false;
			++s1;
			++s2;
		}
		return true;
	}